

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O1

REF_STATUS
ref_migrate_split_dir(REF_MPI ref_mpi,REF_INT n,REF_DBL *xyz,REF_DBL *transform,REF_INT *dir)

{
  double dVar1;
  REF_MPI ref_mpi_00;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  undefined8 *puVar5;
  double dVar6;
  REF_DBL temp;
  REF_DBL maxes [3];
  REF_DBL mins [3];
  REF_DBL transformed [3];
  undefined8 local_98;
  REF_INT *local_90;
  double local_88 [4];
  double local_68 [3];
  REF_MPI local_50;
  REF_DBL local_48 [3];
  
  *dir = 0;
  lVar3 = 0;
  do {
    local_68[lVar3] = 1e+200;
    local_88[lVar3] = -1e+200;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_90 = dir;
  local_50 = ref_mpi;
  if (0 < n) {
    uVar4 = 0;
    do {
      uVar2 = ref_matrix_ax(3,transform,xyz + uVar4 * 3,local_48);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x162,"ref_migrate_split_dir",(ulong)uVar2,"ax");
        return uVar2;
      }
      lVar3 = 0;
      do {
        dVar1 = local_48[lVar3];
        dVar6 = local_68[lVar3];
        if (dVar1 <= local_68[lVar3]) {
          dVar6 = dVar1;
        }
        local_68[lVar3] = dVar6;
        dVar6 = local_88[lVar3];
        if (local_88[lVar3] <= dVar1) {
          dVar6 = dVar1;
        }
        local_88[lVar3] = dVar6;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)n);
  }
  ref_mpi_00 = local_50;
  lVar3 = 0;
  while( true ) {
    puVar5 = (undefined8 *)((long)local_68 + lVar3);
    local_98 = *puVar5;
    uVar2 = ref_mpi_min(ref_mpi_00,&local_98,puVar5,3);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x16a,"ref_migrate_split_dir",(ulong)uVar2,"min");
      return uVar2;
    }
    uVar2 = ref_mpi_bcast(ref_mpi_00,puVar5,1,3);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x16b,"ref_migrate_split_dir",(ulong)uVar2,"bcast");
      return uVar2;
    }
    puVar5 = (undefined8 *)((long)local_88 + lVar3);
    local_98 = *puVar5;
    uVar2 = ref_mpi_max(ref_mpi_00,&local_98,puVar5,3);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x16d,"ref_migrate_split_dir",(ulong)uVar2,"max");
      return uVar2;
    }
    uVar2 = ref_mpi_bcast(ref_mpi_00,puVar5,1,3);
    if (uVar2 != 0) break;
    lVar3 = lVar3 + 8;
    if (lVar3 == 0x18) {
      local_88[1] = local_88[1] - local_68[1];
      if ((local_88[0] - local_68[0] <= local_88[1]) && (local_88[2] - local_68[2] <= local_88[1]))
      {
        *local_90 = 1;
      }
      if ((local_88[0] - local_68[0] <= local_88[2] - local_68[2]) &&
         (local_88[1] <= local_88[2] - local_68[2])) {
        *local_90 = 2;
      }
      return 0;
    }
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x16e,
         "ref_migrate_split_dir",(ulong)uVar2,"bcast");
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_split_dir(REF_MPI ref_mpi, REF_INT n,
                                         REF_DBL *xyz, REF_DBL *transform,
                                         REF_INT *dir) {
  REF_DBL mins[3], maxes[3], temp, transformed[3];
  REF_INT i, j;
  *dir = 0;
  for (j = 0; j < 3; j++) {
    mins[j] = REF_DBL_MAX;
    maxes[j] = REF_DBL_MIN;
  }
  for (i = 0; i < n; i++) {
    RSS(ref_matrix_ax(3, transform, &(xyz[3 * i]), transformed), "ax");
    for (j = 0; j < 3; j++) {
      mins[j] = MIN(mins[j], transformed[j]);
      maxes[j] = MAX(maxes[j], transformed[j]);
    }
  }
  for (j = 0; j < 3; j++) {
    temp = mins[j];
    RSS(ref_mpi_min(ref_mpi, &temp, &(mins[j]), REF_DBL_TYPE), "min");
    RSS(ref_mpi_bcast(ref_mpi, &(mins[j]), 1, REF_DBL_TYPE), "bcast");
    temp = maxes[j];
    RSS(ref_mpi_max(ref_mpi, &temp, &(maxes[j]), REF_DBL_TYPE), "max");
    RSS(ref_mpi_bcast(ref_mpi, &(maxes[j]), 1, REF_DBL_TYPE), "bcast");
  }
  if ((maxes[1] - mins[1]) >= (maxes[0] - mins[0]) &&
      (maxes[1] - mins[1]) >= (maxes[2] - mins[2]))
    *dir = 1;
  if ((maxes[2] - mins[2]) >= (maxes[0] - mins[0]) &&
      (maxes[2] - mins[2]) >= (maxes[1] - mins[1]))
    *dir = 2;

  return REF_SUCCESS;
}